

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cc
# Opt level: O2

bool detect_and_check_crc(uint8_t *buf,size_t buf_len,uint32_t checksum,crc_mode_e *mode)

{
  uint32_t uVar1;
  
  *mode = CRC_UNKNOWN;
  uVar1 = crc32_8(buf,buf_len,0);
  if (uVar1 == checksum) {
    *mode = CRC32;
  }
  return uVar1 == checksum;
}

Assistant:

bool detect_and_check_crc(const uint8_t* buf,
                          size_t buf_len,
                          uint32_t checksum,
                          crc_mode_e* mode) {
    *mode = CRC_UNKNOWN;
#ifdef _CRC32C
    if (perform_integrity_check(buf, buf_len, checksum, CRC32C)) {
        *mode = CRC32C;
        return true;
    } else
#endif
    if (perform_integrity_check(buf, buf_len, checksum, CRC32)) {
        *mode = CRC32;
        return true;
    }

    return false;
}